

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<8,_16777232,_true,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMiMBIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar7;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar8;
  Scene *pSVar9;
  Ref<embree::Geometry> *pRVar10;
  Geometry *pGVar11;
  RTCIntersectArguments *pRVar12;
  bool bVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  AABBNodeMB4D *node1;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  int iVar26;
  ulong uVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  ulong unaff_R12;
  size_t mask;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  bool bVar35;
  byte bVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  float fVar87;
  undefined4 uVar88;
  float fVar89;
  undefined1 auVar90 [16];
  undefined8 uVar91;
  undefined1 auVar92 [32];
  undefined1 auVar93 [64];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  undefined1 auVar104 [32];
  undefined1 auVar105 [64];
  undefined1 auVar106 [32];
  undefined1 auVar107 [64];
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 auVar114 [64];
  undefined1 auVar115 [32];
  undefined1 auVar116 [64];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 in_ZMM29 [64];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  int local_160c;
  long local_1608;
  long local_1600;
  long local_15f8;
  long local_15f0;
  long local_15e8;
  long local_15e0;
  ulong *local_15d8;
  ulong local_15d0;
  ulong local_15c8;
  undefined4 local_15c0;
  undefined4 local_15bc;
  undefined4 local_15b8;
  undefined4 local_15b4;
  undefined4 local_15b0;
  undefined4 local_15ac;
  uint local_15a8;
  uint local_15a4;
  uint local_15a0;
  RTCFilterFunctionNArguments local_1590;
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  float local_14e0;
  float fStack_14dc;
  float fStack_14d8;
  float fStack_14d4;
  float fStack_14d0;
  float fStack_14cc;
  float fStack_14c8;
  float fStack_14c4;
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  float local_1480;
  float fStack_147c;
  float fStack_1478;
  float fStack_1474;
  float fStack_1470;
  float fStack_146c;
  float fStack_1468;
  float fStack_1464;
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  float local_1320;
  float fStack_131c;
  float fStack_1318;
  float fStack_1314;
  float fStack_1310;
  float fStack_130c;
  float fStack_1308;
  uint uStack_1304;
  byte local_1300;
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  float local_1280 [4];
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  undefined4 uStack_1264;
  float local_1260 [4];
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  undefined4 uStack_1244;
  undefined1 local_1240 [32];
  undefined1 local_1220;
  ulong local_1200 [570];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  uVar32 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (uVar32 != 8) {
    fVar98 = ray->tfar;
    vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
    auVar61 = vucomiss_avx512f(ZEXT416((uint)fVar98));
    auVar120 = ZEXT1664(auVar61);
    if (uVar32 < 9) {
      local_15d8 = local_1200 + 1;
      aVar8 = (ray->dir).field_0;
      auVar37 = vmaxss_avx512f(auVar61,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar38._8_4_ = 0x7fffffff;
      auVar38._0_8_ = 0x7fffffff7fffffff;
      auVar38._12_4_ = 0x7fffffff;
      auVar38 = vandps_avx512vl((undefined1  [16])aVar8,auVar38);
      local_1200[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar39._8_4_ = 0x219392ef;
      auVar39._0_8_ = 0x219392ef219392ef;
      auVar39._12_4_ = 0x219392ef;
      uVar32 = vcmpps_avx512vl(auVar38,auVar39,1);
      auVar59._8_4_ = 0x3f800000;
      auVar59._0_8_ = &DAT_3f8000003f800000;
      auVar59._12_4_ = 0x3f800000;
      auVar38 = vdivps_avx(auVar59,(undefined1  [16])aVar8);
      auVar39 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
      bVar35 = (bool)((byte)uVar32 & 1);
      auVar46._0_4_ = (uint)bVar35 * auVar39._0_4_ | (uint)!bVar35 * auVar38._0_4_;
      bVar35 = (bool)((byte)(uVar32 >> 1) & 1);
      auVar46._4_4_ = (uint)bVar35 * auVar39._4_4_ | (uint)!bVar35 * auVar38._4_4_;
      bVar35 = (bool)((byte)(uVar32 >> 2) & 1);
      auVar46._8_4_ = (uint)bVar35 * auVar39._8_4_ | (uint)!bVar35 * auVar38._8_4_;
      bVar35 = (bool)((byte)(uVar32 >> 3) & 1);
      auVar46._12_4_ = (uint)bVar35 * auVar39._12_4_ | (uint)!bVar35 * auVar38._12_4_;
      auVar40._8_4_ = 0x3f7ffffa;
      auVar40._0_8_ = 0x3f7ffffa3f7ffffa;
      auVar40._12_4_ = 0x3f7ffffa;
      vmulps_avx512vl(auVar46,auVar40);
      auVar54._8_4_ = 0x3f800003;
      auVar54._0_8_ = 0x3f8000033f800003;
      auVar54._12_4_ = 0x3f800003;
      auVar40 = vmulps_avx512vl(auVar46,auVar54);
      auVar64 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[0]));
      auVar121 = ZEXT3264(auVar64);
      auVar64 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[1]));
      auVar122 = ZEXT3264(auVar64);
      uVar88 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_1460._4_4_ = uVar88;
      local_1460._0_4_ = uVar88;
      local_1460._8_4_ = uVar88;
      local_1460._12_4_ = uVar88;
      local_1460._16_4_ = uVar88;
      local_1460._20_4_ = uVar88;
      local_1460._24_4_ = uVar88;
      local_1460._28_4_ = uVar88;
      auVar97 = ZEXT3264(local_1460);
      auVar39 = vucomiss_avx512f(auVar61);
      fVar89 = auVar39._0_4_;
      auVar38 = vmovshdup_avx(auVar39);
      uVar91 = auVar38._0_8_;
      local_14a0._8_8_ = uVar91;
      local_14a0._0_8_ = uVar91;
      local_14a0._16_8_ = uVar91;
      local_14a0._24_8_ = uVar91;
      auVar105 = ZEXT3264(local_14a0);
      vshufpd_avx(auVar39,auVar39,1);
      auVar65._8_4_ = 2;
      auVar65._0_8_ = 0x200000002;
      auVar65._12_4_ = 2;
      auVar65._16_4_ = 2;
      auVar65._20_4_ = 2;
      auVar65._24_4_ = 2;
      auVar65._28_4_ = 2;
      local_14c0 = vpermps_avx2(auVar65,ZEXT1632(auVar39));
      auVar107 = ZEXT3264(local_14c0);
      auVar64._8_4_ = 1;
      auVar64._0_8_ = 0x100000001;
      auVar64._12_4_ = 1;
      auVar64._16_4_ = 1;
      auVar64._20_4_ = 1;
      auVar64._24_4_ = 1;
      auVar64._28_4_ = 1;
      fVar87 = auVar40._0_4_;
      local_1500 = vpermps_avx2(auVar64,ZEXT1632(auVar40));
      auVar114 = ZEXT3264(local_1500);
      local_1520 = vpermps_avx2(auVar65,ZEXT1632(auVar40));
      auVar96 = ZEXT3264(local_1520);
      lVar28 = 0;
      vucomiss_avx512f(auVar61);
      lVar29 = 0x40;
      vucomiss_avx512f(auVar61);
      lVar30 = 0x80;
      lVar31 = 0x20;
      lVar25 = 0x60;
      lVar33 = 0xa0;
      uVar88 = auVar37._0_4_;
      local_1540._4_4_ = uVar88;
      local_1540._0_4_ = uVar88;
      local_1540._8_4_ = uVar88;
      local_1540._12_4_ = uVar88;
      local_1540._16_4_ = uVar88;
      local_1540._20_4_ = uVar88;
      local_1540._24_4_ = uVar88;
      local_1540._28_4_ = uVar88;
      auVar93 = ZEXT3264(local_1540);
      local_1560._4_4_ = fVar98;
      local_1560._0_4_ = fVar98;
      local_1560._8_4_ = fVar98;
      local_1560._12_4_ = fVar98;
      local_1560._16_4_ = fVar98;
      local_1560._20_4_ = fVar98;
      local_1560._24_4_ = fVar98;
      local_1560._28_4_ = fVar98;
      auVar116 = ZEXT3264(local_1560);
      local_15e0 = 0;
      local_15e8 = 0x40;
      local_15f0 = 0x80;
      local_15f8 = 0x20;
      local_1600 = 0x60;
      local_1608 = 0xa0;
      fVar98 = fVar89;
      fVar99 = fVar89;
      fVar100 = fVar89;
      fVar101 = fVar89;
      fVar102 = fVar89;
      fVar103 = fVar89;
      fVar108 = fVar87;
      fVar109 = fVar87;
      fVar110 = fVar87;
      fVar111 = fVar87;
      fVar112 = fVar87;
      fVar113 = fVar87;
      local_14e0 = fVar87;
      fStack_14dc = fVar87;
      fStack_14d8 = fVar87;
      fStack_14d4 = fVar87;
      fStack_14d0 = fVar87;
      fStack_14cc = fVar87;
      fStack_14c8 = fVar87;
      fStack_14c4 = fVar87;
      local_1480 = fVar89;
      fStack_147c = fVar89;
      fStack_1478 = fVar89;
      fStack_1474 = fVar89;
      fStack_1470 = fVar89;
      fStack_146c = fVar89;
      fStack_1468 = fVar89;
      fStack_1464 = fVar89;
      do {
        if (local_15d8 == local_1200) {
          return;
        }
        uVar32 = local_15d8[-1];
        local_15d8 = local_15d8 + -1;
        do {
          if ((uVar32 & 8) == 0) {
            uVar21 = uVar32 & 0xfffffffffffffff0;
            uVar88 = *(undefined4 *)((long)&(ray->dir).field_0 + 0xc);
            auVar72._4_4_ = uVar88;
            auVar72._0_4_ = uVar88;
            auVar72._8_4_ = uVar88;
            auVar72._12_4_ = uVar88;
            auVar72._16_4_ = uVar88;
            auVar72._20_4_ = uVar88;
            auVar72._24_4_ = uVar88;
            auVar72._28_4_ = uVar88;
            auVar61 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar21 + 0x100 + lVar28),auVar72,
                                      *(undefined1 (*) [32])(uVar21 + 0x40 + lVar28));
            auVar64 = vsubps_avx512vl(ZEXT1632(auVar61),auVar121._0_32_);
            auVar66._4_4_ = fVar98 * auVar64._4_4_;
            auVar66._0_4_ = fVar89 * auVar64._0_4_;
            auVar66._8_4_ = fVar99 * auVar64._8_4_;
            auVar66._12_4_ = fVar100 * auVar64._12_4_;
            auVar66._16_4_ = fVar101 * auVar64._16_4_;
            auVar66._20_4_ = fVar102 * auVar64._20_4_;
            auVar66._24_4_ = fVar103 * auVar64._24_4_;
            auVar66._28_4_ = auVar64._28_4_;
            auVar64 = vmaxps_avx(auVar93._0_32_,auVar66);
            auVar61 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar21 + 0x100 + lVar29),auVar72,
                                      *(undefined1 (*) [32])(uVar21 + 0x40 + lVar29));
            auVar65 = vsubps_avx512vl(ZEXT1632(auVar61),auVar122._0_32_);
            auVar67._4_4_ = auVar105._4_4_ * auVar65._4_4_;
            auVar67._0_4_ = auVar105._0_4_ * auVar65._0_4_;
            auVar67._8_4_ = auVar105._8_4_ * auVar65._8_4_;
            auVar67._12_4_ = auVar105._12_4_ * auVar65._12_4_;
            auVar67._16_4_ = auVar105._16_4_ * auVar65._16_4_;
            auVar67._20_4_ = auVar105._20_4_ * auVar65._20_4_;
            auVar67._24_4_ = auVar105._24_4_ * auVar65._24_4_;
            auVar67._28_4_ = auVar65._28_4_;
            auVar61 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar21 + 0x100 + lVar30),auVar72,
                                      *(undefined1 (*) [32])(uVar21 + 0x40 + lVar30));
            auVar65 = vsubps_avx(ZEXT1632(auVar61),auVar97._0_32_);
            auVar68._4_4_ = auVar107._4_4_ * auVar65._4_4_;
            auVar68._0_4_ = auVar107._0_4_ * auVar65._0_4_;
            auVar68._8_4_ = auVar107._8_4_ * auVar65._8_4_;
            auVar68._12_4_ = auVar107._12_4_ * auVar65._12_4_;
            auVar68._16_4_ = auVar107._16_4_ * auVar65._16_4_;
            auVar68._20_4_ = auVar107._20_4_ * auVar65._20_4_;
            auVar68._24_4_ = auVar107._24_4_ * auVar65._24_4_;
            auVar68._28_4_ = auVar65._28_4_;
            auVar65 = vmaxps_avx(auVar67,auVar68);
            auVar64 = vmaxps_avx(auVar64,auVar65);
            auVar61 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar21 + 0x100 + lVar31),auVar72,
                                      *(undefined1 (*) [32])(uVar21 + 0x40 + lVar31));
            auVar65 = vsubps_avx512vl(ZEXT1632(auVar61),auVar121._0_32_);
            auVar69._4_4_ = fVar108 * auVar65._4_4_;
            auVar69._0_4_ = fVar87 * auVar65._0_4_;
            auVar69._8_4_ = fVar109 * auVar65._8_4_;
            auVar69._12_4_ = fVar110 * auVar65._12_4_;
            auVar69._16_4_ = fVar111 * auVar65._16_4_;
            auVar69._20_4_ = fVar112 * auVar65._20_4_;
            auVar69._24_4_ = fVar113 * auVar65._24_4_;
            auVar69._28_4_ = auVar65._28_4_;
            auVar65 = vminps_avx(auVar116._0_32_,auVar69);
            auVar61 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar21 + 0x100 + lVar25),auVar72,
                                      *(undefined1 (*) [32])(uVar21 + 0x40 + lVar25));
            auVar66 = vsubps_avx512vl(ZEXT1632(auVar61),auVar122._0_32_);
            auVar70._4_4_ = auVar114._4_4_ * auVar66._4_4_;
            auVar70._0_4_ = auVar114._0_4_ * auVar66._0_4_;
            auVar70._8_4_ = auVar114._8_4_ * auVar66._8_4_;
            auVar70._12_4_ = auVar114._12_4_ * auVar66._12_4_;
            auVar70._16_4_ = auVar114._16_4_ * auVar66._16_4_;
            auVar70._20_4_ = auVar114._20_4_ * auVar66._20_4_;
            auVar70._24_4_ = auVar114._24_4_ * auVar66._24_4_;
            auVar70._28_4_ = auVar66._28_4_;
            auVar61 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar21 + 0x100 + lVar33),auVar72,
                                      *(undefined1 (*) [32])(uVar21 + 0x40 + lVar33));
            auVar66 = vsubps_avx(ZEXT1632(auVar61),auVar97._0_32_);
            auVar71._4_4_ = auVar96._4_4_ * auVar66._4_4_;
            auVar71._0_4_ = auVar96._0_4_ * auVar66._0_4_;
            auVar71._8_4_ = auVar96._8_4_ * auVar66._8_4_;
            auVar71._12_4_ = auVar96._12_4_ * auVar66._12_4_;
            auVar71._16_4_ = auVar96._16_4_ * auVar66._16_4_;
            auVar71._20_4_ = auVar96._20_4_ * auVar66._20_4_;
            auVar71._24_4_ = auVar96._24_4_ * auVar66._24_4_;
            auVar71._28_4_ = auVar66._28_4_;
            auVar66 = vminps_avx(auVar70,auVar71);
            auVar65 = vminps_avx(auVar65,auVar66);
            if (((uint)uVar32 & 7) == 6) {
              uVar91 = vcmpps_avx512vl(auVar64,auVar65,2);
              uVar14 = vcmpps_avx512vl(auVar72,*(undefined1 (*) [32])(uVar21 + 0x1c0),0xd);
              uVar15 = vcmpps_avx512vl(auVar72,*(undefined1 (*) [32])(uVar21 + 0x1e0),1);
              bVar36 = (byte)uVar91 & (byte)uVar14 & (byte)uVar15;
            }
            else {
              uVar91 = vcmpps_avx512vl(auVar64,auVar65,2);
              bVar36 = (byte)uVar91;
            }
            unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),(uint)bVar36);
          }
          if ((uVar32 & 8) == 0) {
            if (unaff_R12 == 0) {
              iVar26 = 4;
            }
            else {
              uVar21 = uVar32 & 0xfffffffffffffff0;
              lVar23 = 0;
              for (uVar32 = unaff_R12; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000)
              {
                lVar23 = lVar23 + 1;
              }
              iVar26 = 0;
              for (uVar22 = unaff_R12 - 1 & unaff_R12; uVar32 = *(ulong *)(uVar21 + lVar23 * 8),
                  uVar22 != 0; uVar22 = uVar22 - 1 & uVar22) {
                *local_15d8 = uVar32;
                local_15d8 = local_15d8 + 1;
                lVar23 = 0;
                for (uVar32 = uVar22; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000)
                {
                  lVar23 = lVar23 + 1;
                }
              }
            }
          }
          else {
            iVar26 = 6;
          }
        } while (iVar26 == 0);
        if (iVar26 == 6) {
          iVar26 = 0;
          local_15d0 = (ulong)((uint)uVar32 & 0xf) - 8;
          bVar35 = local_15d0 != 0;
          if (bVar35) {
            uVar32 = uVar32 & 0xfffffffffffffff0;
            pSVar9 = context->scene;
            local_15c8 = 0;
            do {
              lVar30 = local_15c8 * 0x60;
              pRVar10 = (pSVar9->geometries).items;
              pGVar11 = pRVar10[*(uint *)(uVar32 + 0x40 + lVar30)].ptr;
              fVar98 = (pGVar11->time_range).lower;
              fVar98 = pGVar11->fnumTimeSegments *
                       (((ray->dir).field_0.m128[3] - fVar98) /
                       ((pGVar11->time_range).upper - fVar98));
              auVar61 = vroundss_avx(ZEXT416((uint)fVar98),ZEXT416((uint)fVar98),9);
              auVar61 = vminss_avx(auVar61,ZEXT416((uint)(pGVar11->fnumTimeSegments + -1.0)));
              auVar41 = vmaxss_avx512f(auVar120._0_16_,auVar61);
              iVar26 = (int)auVar41._0_4_;
              lVar31 = (long)iVar26 * 0x38;
              lVar25 = *(long *)(*(long *)&pGVar11[2].numPrimitives + lVar31);
              auVar61 = *(undefined1 (*) [16])(lVar25 + (ulong)*(uint *)(uVar32 + lVar30) * 4);
              uVar24 = (ulong)*(uint *)(uVar32 + 0x10 + lVar30);
              auVar38 = *(undefined1 (*) [16])(lVar25 + uVar24 * 4);
              uVar22 = (ulong)*(uint *)(uVar32 + 0x20 + lVar30);
              auVar39 = *(undefined1 (*) [16])(lVar25 + uVar22 * 4);
              uVar27 = (ulong)*(uint *)(uVar32 + 0x30 + lVar30);
              auVar40 = *(undefined1 (*) [16])(lVar25 + uVar27 * 4);
              uVar21 = (ulong)*(uint *)(uVar32 + 4 + lVar30);
              lVar33 = (long)(iVar26 + 1) * 0x38;
              lVar25 = *(long *)(*(long *)&pGVar11[2].numPrimitives + lVar33);
              auVar54 = *(undefined1 (*) [16])(lVar25 + (ulong)*(uint *)(uVar32 + lVar30) * 4);
              auVar37 = *(undefined1 (*) [16])(lVar25 + uVar24 * 4);
              lVar28 = *(long *)&pRVar10[*(uint *)(uVar32 + 0x44 + lVar30)].ptr[2].numPrimitives;
              lVar29 = *(long *)(lVar28 + lVar31);
              auVar46 = *(undefined1 (*) [16])(lVar29 + uVar21 * 4);
              auVar59 = *(undefined1 (*) [16])(lVar25 + uVar22 * 4);
              uVar24 = (ulong)*(uint *)(uVar32 + 0x14 + lVar30);
              auVar48 = *(undefined1 (*) [16])(lVar29 + uVar24 * 4);
              auVar62 = *(undefined1 (*) [16])(lVar25 + uVar27 * 4);
              uVar22 = (ulong)*(uint *)(uVar32 + 0x24 + lVar30);
              auVar51 = *(undefined1 (*) [16])(lVar29 + uVar22 * 4);
              uVar27 = (ulong)*(uint *)(uVar32 + 0x34 + lVar30);
              auVar53 = *(undefined1 (*) [16])(lVar29 + uVar27 * 4);
              lVar25 = *(long *)&pRVar10[*(uint *)(uVar32 + 0x48 + lVar30)].ptr[2].numPrimitives;
              lVar28 = *(long *)(lVar28 + lVar33);
              auVar56 = *(undefined1 (*) [16])(lVar28 + uVar21 * 4);
              lVar29 = *(long *)(lVar25 + lVar31);
              auVar57 = *(undefined1 (*) [16])(lVar28 + uVar24 * 4);
              uVar24 = (ulong)*(uint *)(uVar32 + 8 + lVar30);
              auVar43 = *(undefined1 (*) [16])(lVar29 + uVar24 * 4);
              auVar60 = *(undefined1 (*) [16])(lVar28 + uVar22 * 4);
              uVar21 = (ulong)*(uint *)(uVar32 + 0x18 + lVar30);
              auVar47 = *(undefined1 (*) [16])(lVar29 + uVar21 * 4);
              auVar63 = *(undefined1 (*) [16])(lVar28 + uVar27 * 4);
              uVar22 = (ulong)*(uint *)(uVar32 + 0x28 + lVar30);
              auVar50 = *(undefined1 (*) [16])(lVar29 + uVar22 * 4);
              uVar34 = (ulong)*(uint *)(uVar32 + 0x38 + lVar30);
              auVar52 = *(undefined1 (*) [16])(lVar29 + uVar34 * 4);
              lVar25 = *(long *)(lVar25 + lVar33);
              auVar55 = *(undefined1 (*) [16])(lVar25 + uVar24 * 4);
              lVar28 = *(long *)&pRVar10[*(uint *)(uVar32 + 0x4c + lVar30)].ptr[2].numPrimitives;
              lVar29 = *(long *)(lVar28 + lVar31);
              auVar58 = *(undefined1 (*) [16])(lVar25 + uVar21 * 4);
              uVar27 = (ulong)*(uint *)(uVar32 + 0xc + lVar30);
              auVar45 = *(undefined1 (*) [16])(lVar29 + uVar27 * 4);
              auVar90 = *(undefined1 (*) [16])(lVar25 + uVar22 * 4);
              uVar22 = (ulong)*(uint *)(uVar32 + 0x1c + lVar30);
              auVar49 = *(undefined1 (*) [16])(lVar29 + uVar22 * 4);
              auVar42 = vunpcklps_avx512vl(auVar61,auVar43);
              auVar43 = vunpckhps_avx512vl(auVar61,auVar43);
              auVar44 = vunpcklps_avx512vl(auVar46,auVar45);
              auVar46 = vunpckhps_avx(auVar46,auVar45);
              auVar61 = *(undefined1 (*) [16])(lVar25 + uVar34 * 4);
              uVar21 = (ulong)*(uint *)(uVar32 + 0x2c + lVar30);
              auVar43 = vunpcklps_avx(auVar43,auVar46);
              auVar45 = vunpcklps_avx512vl(auVar42,auVar44);
              auVar42 = vunpckhps_avx512vl(auVar42,auVar44);
              auVar46 = vunpcklps_avx512vl(auVar38,auVar47);
              auVar47 = vunpckhps_avx512vl(auVar38,auVar47);
              auVar44 = vunpcklps_avx512vl(auVar48,auVar49);
              auVar48 = vunpckhps_avx512vl(auVar48,auVar49);
              auVar38 = *(undefined1 (*) [16])(lVar29 + uVar21 * 4);
              uVar24 = (ulong)*(uint *)(uVar32 + 0x3c + lVar30);
              auVar48 = vunpcklps_avx(auVar47,auVar48);
              auVar47 = vunpcklps_avx512vl(auVar46,auVar44);
              auVar46 = vunpckhps_avx(auVar46,auVar44);
              auVar49 = vunpcklps_avx512vl(auVar39,auVar50);
              auVar39 = vunpckhps_avx512vl(auVar39,auVar50);
              auVar50 = vunpcklps_avx512vl(auVar51,auVar38);
              auVar51 = vunpckhps_avx512vl(auVar51,auVar38);
              auVar38 = *(undefined1 (*) [16])(lVar29 + uVar24 * 4);
              lVar25 = *(long *)(lVar28 + lVar33);
              auVar51 = vunpcklps_avx(auVar39,auVar51);
              auVar44 = vunpcklps_avx512vl(auVar49,auVar50);
              auVar39 = vunpckhps_avx(auVar49,auVar50);
              auVar50 = vunpcklps_avx512vl(auVar40,auVar52);
              auVar40 = vunpckhps_avx512vl(auVar40,auVar52);
              auVar52 = vunpcklps_avx512vl(auVar53,auVar38);
              auVar53 = vunpckhps_avx512vl(auVar53,auVar38);
              auVar38 = *(undefined1 (*) [16])(lVar25 + uVar27 * 4);
              auVar40 = vunpcklps_avx(auVar40,auVar53);
              auVar53 = vunpcklps_avx512vl(auVar50,auVar52);
              auVar50 = vunpckhps_avx512vl(auVar50,auVar52);
              auVar52 = vunpcklps_avx512vl(auVar54,auVar55);
              auVar54 = vunpckhps_avx512vl(auVar54,auVar55);
              auVar55 = vunpcklps_avx512vl(auVar56,auVar38);
              auVar56 = vunpckhps_avx512vl(auVar56,auVar38);
              auVar38 = *(undefined1 (*) [16])(lVar25 + uVar22 * 4);
              auVar56 = vunpcklps_avx512vl(auVar54,auVar56);
              auVar49 = vunpcklps_avx512vl(auVar52,auVar55);
              auVar52 = vunpckhps_avx512vl(auVar52,auVar55);
              auVar55 = vunpcklps_avx512vl(auVar37,auVar58);
              auVar54 = vunpckhps_avx512vl(auVar37,auVar58);
              auVar37 = vunpcklps_avx512vl(auVar57,auVar38);
              auVar57 = vunpckhps_avx512vl(auVar57,auVar38);
              auVar38 = *(undefined1 (*) [16])(lVar25 + uVar21 * 4);
              auVar54 = vunpcklps_avx(auVar54,auVar57);
              auVar57 = vunpcklps_avx512vl(auVar55,auVar37);
              auVar55 = vunpckhps_avx512vl(auVar55,auVar37);
              auVar58 = vunpcklps_avx512vl(auVar59,auVar90);
              auVar37 = vunpckhps_avx512vl(auVar59,auVar90);
              auVar59 = vunpcklps_avx512vl(auVar60,auVar38);
              auVar60 = vunpckhps_avx512vl(auVar60,auVar38);
              auVar38 = *(undefined1 (*) [16])(lVar25 + uVar24 * 4);
              auVar37 = vunpcklps_avx(auVar37,auVar60);
              auVar60 = vunpcklps_avx512vl(auVar58,auVar59);
              auVar59 = vunpckhps_avx512vl(auVar58,auVar59);
              auVar58 = vunpcklps_avx512vl(auVar62,auVar61);
              auVar61 = vunpckhps_avx512vl(auVar62,auVar61);
              auVar62 = vunpcklps_avx512vl(auVar63,auVar38);
              auVar38 = vunpckhps_avx512vl(auVar63,auVar38);
              auVar61 = vunpcklps_avx(auVar61,auVar38);
              auVar63 = vunpcklps_avx512vl(auVar58,auVar62);
              auVar62 = vunpckhps_avx512vl(auVar58,auVar62);
              auVar38 = ZEXT416((uint)(fVar98 - auVar41._0_4_));
              auVar58 = vbroadcastss_avx512vl(auVar38);
              auVar38 = vsubss_avx512f(ZEXT416(0x3f800000),auVar38);
              auVar90._0_4_ = auVar38._0_4_;
              auVar90._4_4_ = auVar90._0_4_;
              auVar90._8_4_ = auVar90._0_4_;
              auVar90._12_4_ = auVar90._0_4_;
              auVar38 = vmulps_avx512vl(auVar58,auVar49);
              auVar45 = vfmadd231ps_avx512vl(auVar38,auVar90,auVar45);
              auVar38 = vmulps_avx512vl(auVar58,auVar52);
              auVar52 = vfmadd231ps_avx512vl(auVar38,auVar90,auVar42);
              auVar38 = vmulps_avx512vl(auVar58,auVar56);
              auVar38 = vfmadd231ps_fma(auVar38,auVar90,auVar43);
              auVar56 = vmulps_avx512vl(auVar58,auVar57);
              auVar57 = vmulps_avx512vl(auVar58,auVar55);
              auVar43 = vmulps_avx512vl(auVar58,auVar54);
              auVar56 = vfmadd231ps_avx512vl(auVar56,auVar90,auVar47);
              auVar54 = vfmadd231ps_fma(auVar57,auVar90,auVar46);
              auVar46 = vfmadd231ps_fma(auVar43,auVar90,auVar48);
              auVar48 = vmulps_avx512vl(auVar58,auVar60);
              auVar59 = vmulps_avx512vl(auVar58,auVar59);
              auVar37 = vmulps_avx512vl(auVar58,auVar37);
              auVar48 = vfmadd231ps_avx512vl(auVar48,auVar90,auVar44);
              auVar39 = vfmadd231ps_fma(auVar59,auVar90,auVar39);
              auVar37 = vfmadd231ps_fma(auVar37,auVar90,auVar51);
              auVar59 = vmulps_avx512vl(auVar58,auVar63);
              auVar62 = vmulps_avx512vl(auVar58,auVar62);
              auVar51 = vmulps_avx512vl(auVar58,auVar61);
              auVar61 = vfmadd231ps_fma(auVar59,auVar90,auVar53);
              auVar59 = vfmadd231ps_fma(auVar62,auVar90,auVar50);
              auVar40 = vfmadd231ps_fma(auVar51,auVar90,auVar40);
              auVar64 = vinsertf32x4_avx512vl(ZEXT1632(auVar45),auVar48,1);
              auVar65 = vinsertf32x4_avx512vl(ZEXT1632(auVar52),auVar39,1);
              auVar74._16_16_ = auVar37;
              auVar74._0_16_ = auVar38;
              auVar77._16_16_ = auVar56;
              auVar77._0_16_ = auVar56;
              auVar78._16_16_ = auVar54;
              auVar78._0_16_ = auVar54;
              auVar75._16_16_ = auVar46;
              auVar75._0_16_ = auVar46;
              auVar117._16_16_ = auVar61;
              auVar117._0_16_ = auVar61;
              auVar76._16_16_ = auVar59;
              auVar76._0_16_ = auVar59;
              uVar88 = *(undefined4 *)&(ray->org).field_0;
              auVar119._4_4_ = uVar88;
              auVar119._0_4_ = uVar88;
              auVar119._8_4_ = uVar88;
              auVar119._12_4_ = uVar88;
              auVar119._16_4_ = uVar88;
              auVar119._20_4_ = uVar88;
              auVar119._24_4_ = uVar88;
              auVar119._28_4_ = uVar88;
              auVar66 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[1]));
              auVar67 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[2]));
              uVar88 = *(undefined4 *)&(ray->dir).field_0;
              auVar92._4_4_ = uVar88;
              auVar92._0_4_ = uVar88;
              auVar92._8_4_ = uVar88;
              auVar92._12_4_ = uVar88;
              auVar92._16_4_ = uVar88;
              auVar92._20_4_ = uVar88;
              auVar92._24_4_ = uVar88;
              auVar92._28_4_ = uVar88;
              uVar88 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
              auVar94._4_4_ = uVar88;
              auVar94._0_4_ = uVar88;
              auVar94._8_4_ = uVar88;
              auVar94._12_4_ = uVar88;
              auVar94._16_4_ = uVar88;
              auVar94._20_4_ = uVar88;
              auVar94._24_4_ = uVar88;
              auVar94._28_4_ = uVar88;
              auVar115._16_16_ = auVar40;
              auVar115._0_16_ = auVar40;
              fVar7 = (ray->dir).field_0.m128[2];
              auVar104._4_4_ = fVar7;
              auVar104._0_4_ = fVar7;
              auVar104._8_4_ = fVar7;
              auVar104._12_4_ = fVar7;
              auVar104._16_4_ = fVar7;
              auVar104._20_4_ = fVar7;
              auVar104._24_4_ = fVar7;
              auVar104._28_4_ = fVar7;
              auVar64 = vsubps_avx(auVar64,auVar119);
              auVar68 = vsubps_avx512vl(auVar65,auVar66);
              auVar69 = vsubps_avx512vl(auVar74,auVar67);
              auVar70 = vsubps_avx512vl(auVar77,auVar119);
              auVar71 = vsubps_avx512vl(auVar78,auVar66);
              auVar72 = vsubps_avx512vl(auVar75,auVar67);
              auVar65 = vsubps_avx(auVar117,auVar119);
              auVar73 = vsubps_avx512vl(auVar76,auVar66);
              auVar67 = vsubps_avx512vl(auVar115,auVar67);
              auVar66 = vsubps_avx(auVar65,auVar64);
              auVar74 = vsubps_avx512vl(auVar73,auVar68);
              auVar75 = vsubps_avx512vl(auVar67,auVar69);
              auVar76 = vsubps_avx512vl(auVar64,auVar70);
              auVar77 = vsubps_avx512vl(auVar68,auVar71);
              auVar78 = vsubps_avx512vl(auVar69,auVar72);
              auVar84._0_4_ = auVar65._0_4_ + auVar64._0_4_;
              auVar84._4_4_ = auVar65._4_4_ + auVar64._4_4_;
              auVar84._8_4_ = auVar65._8_4_ + auVar64._8_4_;
              auVar84._12_4_ = auVar65._12_4_ + auVar64._12_4_;
              auVar84._16_4_ = auVar65._16_4_ + auVar64._16_4_;
              auVar84._20_4_ = auVar65._20_4_ + auVar64._20_4_;
              auVar84._24_4_ = auVar65._24_4_ + auVar64._24_4_;
              auVar84._28_4_ = auVar65._28_4_ + auVar64._28_4_;
              auVar79 = vaddps_avx512vl(auVar73,auVar68);
              auVar80 = vaddps_avx512vl(auVar67,auVar69);
              auVar81._4_4_ = auVar75._4_4_ * auVar79._4_4_;
              auVar81._0_4_ = auVar75._0_4_ * auVar79._0_4_;
              auVar81._8_4_ = auVar75._8_4_ * auVar79._8_4_;
              auVar81._12_4_ = auVar75._12_4_ * auVar79._12_4_;
              auVar81._16_4_ = auVar75._16_4_ * auVar79._16_4_;
              auVar81._20_4_ = auVar75._20_4_ * auVar79._20_4_;
              auVar81._24_4_ = auVar75._24_4_ * auVar79._24_4_;
              auVar81._28_4_ = auVar46._12_4_;
              auVar38 = vfmsub231ps_fma(auVar81,auVar74,auVar80);
              auVar82._4_4_ = auVar66._4_4_ * auVar80._4_4_;
              auVar82._0_4_ = auVar66._0_4_ * auVar80._0_4_;
              auVar82._8_4_ = auVar66._8_4_ * auVar80._8_4_;
              auVar82._12_4_ = auVar66._12_4_ * auVar80._12_4_;
              auVar82._16_4_ = auVar66._16_4_ * auVar80._16_4_;
              auVar82._20_4_ = auVar66._20_4_ * auVar80._20_4_;
              auVar82._24_4_ = auVar66._24_4_ * auVar80._24_4_;
              auVar82._28_4_ = auVar80._28_4_;
              auVar61 = vfmsub231ps_fma(auVar82,auVar75,auVar84);
              auVar80._4_4_ = auVar74._4_4_ * auVar84._4_4_;
              auVar80._0_4_ = auVar74._0_4_ * auVar84._0_4_;
              auVar80._8_4_ = auVar74._8_4_ * auVar84._8_4_;
              auVar80._12_4_ = auVar74._12_4_ * auVar84._12_4_;
              auVar80._16_4_ = auVar74._16_4_ * auVar84._16_4_;
              auVar80._20_4_ = auVar74._20_4_ * auVar84._20_4_;
              auVar80._24_4_ = auVar74._24_4_ * auVar84._24_4_;
              auVar80._28_4_ = auVar84._28_4_;
              auVar39 = vfmsub231ps_fma(auVar80,auVar66,auVar79);
              auVar85._0_4_ = fVar7 * auVar39._0_4_;
              auVar85._4_4_ = fVar7 * auVar39._4_4_;
              auVar85._8_4_ = fVar7 * auVar39._8_4_;
              auVar85._12_4_ = fVar7 * auVar39._12_4_;
              auVar85._16_4_ = fVar7 * 0.0;
              auVar85._20_4_ = fVar7 * 0.0;
              auVar85._24_4_ = fVar7 * 0.0;
              auVar85._28_4_ = 0;
              auVar61 = vfmadd231ps_fma(auVar85,auVar94,ZEXT1632(auVar61));
              auVar61 = vfmadd231ps_fma(ZEXT1632(auVar61),auVar92,ZEXT1632(auVar38));
              auVar81 = vaddps_avx512vl(auVar64,auVar70);
              auVar82 = vaddps_avx512vl(auVar68,auVar71);
              auVar80 = vaddps_avx512vl(auVar69,auVar72);
              auVar79 = vmulps_avx512vl(auVar82,auVar78);
              auVar83 = vfmsub231ps_avx512vl(auVar79,auVar77,auVar80);
              auVar79._4_4_ = auVar80._4_4_ * auVar76._4_4_;
              auVar79._0_4_ = auVar80._0_4_ * auVar76._0_4_;
              auVar79._8_4_ = auVar80._8_4_ * auVar76._8_4_;
              auVar79._12_4_ = auVar80._12_4_ * auVar76._12_4_;
              auVar79._16_4_ = auVar80._16_4_ * auVar76._16_4_;
              auVar79._20_4_ = auVar80._20_4_ * auVar76._20_4_;
              auVar79._24_4_ = auVar80._24_4_ * auVar76._24_4_;
              auVar79._28_4_ = auVar80._28_4_;
              auVar80 = vfmsub231ps_avx512vl(auVar79,auVar78,auVar81);
              auVar81 = vmulps_avx512vl(auVar81,auVar77);
              auVar38 = vfmsub231ps_fma(auVar81,auVar76,auVar82);
              auVar81 = vsubps_avx512vl(auVar70,auVar65);
              auVar106._0_4_ = fVar7 * auVar38._0_4_;
              auVar106._4_4_ = fVar7 * auVar38._4_4_;
              auVar106._8_4_ = fVar7 * auVar38._8_4_;
              auVar106._12_4_ = fVar7 * auVar38._12_4_;
              auVar106._16_4_ = fVar7 * 0.0;
              auVar106._20_4_ = fVar7 * 0.0;
              auVar106._24_4_ = fVar7 * 0.0;
              auVar106._28_4_ = 0;
              auVar38 = vfmadd231ps_fma(auVar106,auVar94,auVar80);
              auVar82 = vsubps_avx512vl(auVar71,auVar73);
              local_13a0 = vfmadd231ps_avx512vl(ZEXT1632(auVar38),auVar92,auVar83);
              auVar80 = vsubps_avx512vl(auVar72,auVar67);
              auVar65 = vaddps_avx512vl(auVar70,auVar65);
              auVar70 = vaddps_avx512vl(auVar71,auVar73);
              auVar67 = vaddps_avx512vl(auVar72,auVar67);
              auVar71 = vmulps_avx512vl(auVar70,auVar80);
              auVar71 = vfmsub231ps_avx512vl(auVar71,auVar82,auVar67);
              auVar67 = vmulps_avx512vl(auVar67,auVar81);
              auVar67 = vfmsub231ps_avx512vl(auVar67,auVar80,auVar65);
              auVar83._4_4_ = auVar65._4_4_ * auVar82._4_4_;
              auVar83._0_4_ = auVar65._0_4_ * auVar82._0_4_;
              auVar83._8_4_ = auVar65._8_4_ * auVar82._8_4_;
              auVar83._12_4_ = auVar65._12_4_ * auVar82._12_4_;
              auVar83._16_4_ = auVar65._16_4_ * auVar82._16_4_;
              auVar83._20_4_ = auVar65._20_4_ * auVar82._20_4_;
              auVar83._24_4_ = auVar65._24_4_ * auVar82._24_4_;
              auVar83._28_4_ = auVar65._28_4_;
              auVar65 = vfmsub231ps_avx512vl(auVar83,auVar81,auVar70);
              auVar65 = vmulps_avx512vl(auVar104,auVar65);
              auVar65 = vfmadd231ps_avx512vl(auVar65,auVar94,auVar67);
              auVar65 = vfmadd231ps_avx512vl(auVar65,auVar92,auVar71);
              auVar118._0_4_ = local_13a0._0_4_ + auVar61._0_4_;
              auVar118._4_4_ = local_13a0._4_4_ + auVar61._4_4_;
              auVar118._8_4_ = local_13a0._8_4_ + auVar61._8_4_;
              auVar118._12_4_ = local_13a0._12_4_ + auVar61._12_4_;
              auVar118._16_4_ = local_13a0._16_4_ + 0.0;
              auVar118._20_4_ = local_13a0._20_4_ + 0.0;
              auVar118._24_4_ = local_13a0._24_4_ + 0.0;
              auVar118._28_4_ = local_13a0._28_4_ + 0.0;
              local_1380 = vaddps_avx512vl(auVar65,auVar118);
              auVar67 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              vandps_avx512vl(local_1380,auVar67);
              auVar73._8_4_ = 0x34000000;
              auVar73._0_8_ = 0x3400000034000000;
              auVar73._12_4_ = 0x34000000;
              auVar73._16_4_ = 0x34000000;
              auVar73._20_4_ = 0x34000000;
              auVar73._24_4_ = 0x34000000;
              auVar73._28_4_ = 0x34000000;
              auVar70 = vmulps_avx512vl(auVar67,auVar73);
              auVar71 = vminps_avx512vl(ZEXT1632(auVar61),local_13a0);
              auVar71 = vminps_avx512vl(auVar71,auVar65);
              auVar72 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar73 = vxorps_avx512vl(auVar70,auVar72);
              uVar91 = vcmpps_avx512vl(auVar71,auVar73,5);
              auVar71 = vmaxps_avx512vl(ZEXT1632(auVar61),local_13a0);
              auVar65 = vmaxps_avx512vl(auVar71,auVar65);
              uVar14 = vcmpps_avx512vl(auVar65,auVar70,2);
              auVar65 = vbroadcasti32x4_avx512vl(*(undefined1 (*) [16])(uVar32 + 0x10 + lVar30));
              local_13e0 = vmovdqa64_avx512vl(auVar65);
              auVar65 = vbroadcasti32x4_avx512vl(*(undefined1 (*) [16])(uVar32 + 0x14 + lVar30));
              local_1400 = vmovdqa64_avx512vl(auVar65);
              local_1300 = (byte)uVar91 | (byte)uVar14;
              auVar65 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              fVar98 = fStack_147c;
              fVar99 = fStack_1478;
              fVar100 = fStack_1474;
              fVar101 = fStack_1470;
              fVar102 = fStack_146c;
              fVar103 = fStack_1468;
              fVar89 = local_1480;
              fVar108 = fStack_14dc;
              fVar109 = fStack_14d8;
              fVar110 = fStack_14d4;
              fVar111 = fStack_14d0;
              fVar112 = fStack_14cc;
              fVar113 = fStack_14c8;
              fVar87 = local_14e0;
              if (local_1300 == 0) {
LAB_0072b153:
                auVar97 = ZEXT3264(local_1460);
                auVar105 = ZEXT3264(local_14a0);
                auVar107 = ZEXT3264(local_14c0);
                auVar114 = ZEXT3264(local_1500);
                auVar96 = ZEXT3264(local_1520);
                auVar93 = ZEXT3264(local_1540);
                auVar116 = ZEXT3264(local_1560);
              }
              else {
                auVar70 = vmulps_avx512vl(auVar75,auVar77);
                auVar71 = vmulps_avx512vl(auVar66,auVar78);
                auVar73 = vmulps_avx512vl(auVar74,auVar76);
                auVar79 = vmulps_avx512vl(auVar78,auVar82);
                auVar83 = vmulps_avx512vl(auVar76,auVar80);
                auVar84 = vmulps_avx512vl(auVar77,auVar81);
                auVar74 = vfmsub213ps_avx512vl(auVar74,auVar78,auVar70);
                auVar75 = vfmsub213ps_avx512vl(auVar75,auVar76,auVar71);
                auVar66 = vfmsub213ps_avx512vl(auVar66,auVar77,auVar73);
                auVar80 = vfmsub213ps_avx512vl(auVar80,auVar77,auVar79);
                auVar81 = vfmsub213ps_avx512vl(auVar81,auVar78,auVar83);
                auVar82 = vfmsub213ps_avx512vl(auVar82,auVar76,auVar84);
                vandps_avx512vl(auVar70,auVar67);
                vandps_avx512vl(auVar79,auVar67);
                uVar21 = vcmpps_avx512vl(auVar82,auVar82,1);
                vandps_avx512vl(auVar71,auVar67);
                vandps_avx512vl(auVar83,auVar67);
                uVar22 = vcmpps_avx512vl(auVar82,auVar82,1);
                vandps_avx512vl(auVar73,auVar67);
                vandps_avx512vl(auVar84,auVar67);
                uVar24 = vcmpps_avx512vl(auVar82,auVar82,1);
                bVar13 = (bool)((byte)uVar21 & 1);
                local_1360._0_4_ =
                     (float)((uint)bVar13 * auVar74._0_4_ | (uint)!bVar13 * auVar80._0_4_);
                bVar13 = (bool)((byte)(uVar21 >> 1) & 1);
                local_1360._4_4_ =
                     (float)((uint)bVar13 * auVar74._4_4_ | (uint)!bVar13 * auVar80._4_4_);
                bVar13 = (bool)((byte)(uVar21 >> 2) & 1);
                local_1360._8_4_ =
                     (float)((uint)bVar13 * auVar74._8_4_ | (uint)!bVar13 * auVar80._8_4_);
                bVar13 = (bool)((byte)(uVar21 >> 3) & 1);
                local_1360._12_4_ =
                     (float)((uint)bVar13 * auVar74._12_4_ | (uint)!bVar13 * auVar80._12_4_);
                bVar13 = (bool)((byte)(uVar21 >> 4) & 1);
                local_1360._16_4_ =
                     (float)((uint)bVar13 * auVar74._16_4_ | (uint)!bVar13 * auVar80._16_4_);
                bVar13 = (bool)((byte)(uVar21 >> 5) & 1);
                local_1360._20_4_ =
                     (float)((uint)bVar13 * auVar74._20_4_ | (uint)!bVar13 * auVar80._20_4_);
                bVar13 = (bool)((byte)(uVar21 >> 6) & 1);
                local_1360._24_4_ =
                     (float)((uint)bVar13 * auVar74._24_4_ | (uint)!bVar13 * auVar80._24_4_);
                bVar13 = SUB81(uVar21 >> 7,0);
                local_1360._28_4_ = (uint)bVar13 * auVar74._28_4_ | (uint)!bVar13 * auVar80._28_4_;
                bVar13 = (bool)((byte)uVar22 & 1);
                local_1340._0_4_ =
                     (float)((uint)bVar13 * auVar75._0_4_ | (uint)!bVar13 * auVar81._0_4_);
                bVar13 = (bool)((byte)(uVar22 >> 1) & 1);
                local_1340._4_4_ =
                     (float)((uint)bVar13 * auVar75._4_4_ | (uint)!bVar13 * auVar81._4_4_);
                bVar13 = (bool)((byte)(uVar22 >> 2) & 1);
                local_1340._8_4_ =
                     (float)((uint)bVar13 * auVar75._8_4_ | (uint)!bVar13 * auVar81._8_4_);
                bVar13 = (bool)((byte)(uVar22 >> 3) & 1);
                local_1340._12_4_ =
                     (float)((uint)bVar13 * auVar75._12_4_ | (uint)!bVar13 * auVar81._12_4_);
                bVar13 = (bool)((byte)(uVar22 >> 4) & 1);
                local_1340._16_4_ =
                     (float)((uint)bVar13 * auVar75._16_4_ | (uint)!bVar13 * auVar81._16_4_);
                bVar13 = (bool)((byte)(uVar22 >> 5) & 1);
                local_1340._20_4_ =
                     (float)((uint)bVar13 * auVar75._20_4_ | (uint)!bVar13 * auVar81._20_4_);
                bVar13 = (bool)((byte)(uVar22 >> 6) & 1);
                local_1340._24_4_ =
                     (float)((uint)bVar13 * auVar75._24_4_ | (uint)!bVar13 * auVar81._24_4_);
                bVar13 = SUB81(uVar22 >> 7,0);
                local_1340._28_4_ = (uint)bVar13 * auVar75._28_4_ | (uint)!bVar13 * auVar81._28_4_;
                bVar13 = (bool)((byte)uVar24 & 1);
                local_1320 = (float)((uint)bVar13 * auVar66._0_4_ | (uint)!bVar13 * auVar82._0_4_);
                bVar13 = (bool)((byte)(uVar24 >> 1) & 1);
                fStack_131c = (float)((uint)bVar13 * auVar66._4_4_ | (uint)!bVar13 * auVar82._4_4_);
                bVar13 = (bool)((byte)(uVar24 >> 2) & 1);
                fStack_1318 = (float)((uint)bVar13 * auVar66._8_4_ | (uint)!bVar13 * auVar82._8_4_);
                bVar13 = (bool)((byte)(uVar24 >> 3) & 1);
                fStack_1314 = (float)((uint)bVar13 * auVar66._12_4_ | (uint)!bVar13 * auVar82._12_4_
                                     );
                bVar13 = (bool)((byte)(uVar24 >> 4) & 1);
                fStack_1310 = (float)((uint)bVar13 * auVar66._16_4_ | (uint)!bVar13 * auVar82._16_4_
                                     );
                bVar13 = (bool)((byte)(uVar24 >> 5) & 1);
                fStack_130c = (float)((uint)bVar13 * auVar66._20_4_ | (uint)!bVar13 * auVar82._20_4_
                                     );
                bVar13 = (bool)((byte)(uVar24 >> 6) & 1);
                fStack_1308 = (float)((uint)bVar13 * auVar66._24_4_ | (uint)!bVar13 * auVar82._24_4_
                                     );
                bVar13 = SUB81(uVar24 >> 7,0);
                auVar19._4_4_ = fVar7 * fStack_131c;
                auVar19._0_4_ = fVar7 * local_1320;
                auVar19._8_4_ = fVar7 * fStack_1318;
                auVar19._12_4_ = fVar7 * fStack_1314;
                auVar19._16_4_ = fVar7 * fStack_1310;
                auVar19._20_4_ = fVar7 * fStack_130c;
                auVar19._24_4_ = fVar7 * fStack_1308;
                auVar19._28_4_ = fVar7;
                auVar38 = vfmadd213ps_fma(auVar94,local_1340,auVar19);
                auVar38 = vfmadd213ps_fma(auVar92,local_1360,ZEXT1632(auVar38));
                auVar70 = ZEXT1632(CONCAT412(auVar38._12_4_ + auVar38._12_4_,
                                             CONCAT48(auVar38._8_4_ + auVar38._8_4_,
                                                      CONCAT44(auVar38._4_4_ + auVar38._4_4_,
                                                               auVar38._0_4_ + auVar38._0_4_))));
                auVar95._0_4_ = auVar69._0_4_ * local_1320;
                auVar95._4_4_ = auVar69._4_4_ * fStack_131c;
                auVar95._8_4_ = auVar69._8_4_ * fStack_1318;
                auVar95._12_4_ = auVar69._12_4_ * fStack_1314;
                auVar95._16_4_ = auVar69._16_4_ * fStack_1310;
                auVar95._20_4_ = auVar69._20_4_ * fStack_130c;
                auVar95._24_4_ = auVar69._24_4_ * fStack_1308;
                auVar95._28_4_ = 0;
                auVar38 = vfmadd213ps_fma(auVar68,local_1340,auVar95);
                auVar39 = vfmadd213ps_fma(auVar64,local_1360,ZEXT1632(auVar38));
                auVar64 = vrcp14ps_avx512vl(auVar70);
                auVar68 = vfnmadd213ps_avx512vl(auVar64,auVar70,auVar65);
                auVar38 = vfmadd132ps_fma(auVar68,auVar64,auVar64);
                local_12a0 = ZEXT1632(CONCAT412((auVar39._12_4_ + auVar39._12_4_) * auVar38._12_4_,
                                                CONCAT48((auVar39._8_4_ + auVar39._8_4_) *
                                                         auVar38._8_4_,
                                                         CONCAT44((auVar39._4_4_ + auVar39._4_4_) *
                                                                  auVar38._4_4_,
                                                                  (auVar39._0_4_ + auVar39._0_4_) *
                                                                  auVar38._0_4_))));
                uVar88 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
                auVar16._4_4_ = uVar88;
                auVar16._0_4_ = uVar88;
                auVar16._8_4_ = uVar88;
                auVar16._12_4_ = uVar88;
                auVar16._16_4_ = uVar88;
                auVar16._20_4_ = uVar88;
                auVar16._24_4_ = uVar88;
                auVar16._28_4_ = uVar88;
                uVar91 = vcmpps_avx512vl(local_12a0,auVar16,0xd);
                auVar64 = vxorps_avx512vl(auVar70,auVar72);
                fVar7 = ray->tfar;
                auVar17._4_4_ = fVar7;
                auVar17._0_4_ = fVar7;
                auVar17._8_4_ = fVar7;
                auVar17._12_4_ = fVar7;
                auVar17._16_4_ = fVar7;
                auVar17._20_4_ = fVar7;
                auVar17._24_4_ = fVar7;
                auVar17._28_4_ = fVar7;
                uVar14 = vcmpps_avx512vl(local_12a0,auVar17,2);
                uVar15 = vcmpps_avx512vl(auVar70,auVar64,4);
                local_1300 = (byte)uVar91 & (byte)uVar14 & (byte)uVar15 & local_1300;
                if (local_1300 == 0) goto LAB_0072b153;
                local_13c0 = ZEXT1632(auVar61);
                uStack_1304 = (uint)bVar13 * auVar66._28_4_ | (uint)!bVar13 * auVar82._28_4_;
                local_1220 = 0xf0;
                auVar18._8_4_ = 0x219392ef;
                auVar18._0_8_ = 0x219392ef219392ef;
                auVar18._12_4_ = 0x219392ef;
                auVar18._16_4_ = 0x219392ef;
                auVar18._20_4_ = 0x219392ef;
                auVar18._24_4_ = 0x219392ef;
                auVar18._28_4_ = 0x219392ef;
                uVar21 = vcmpps_avx512vl(auVar67,auVar18,5);
                auVar64 = vrcp14ps_avx512vl(local_1380);
                auVar66 = vfnmadd213ps_avx512vl(local_1380,auVar64,auVar65);
                auVar66 = vfmadd132ps_avx512vl(auVar66,auVar64,auVar64);
                fVar1 = (float)((uint)((byte)uVar21 & 1) * auVar66._0_4_);
                fVar7 = (float)((uint)((byte)(uVar21 >> 1) & 1) * auVar66._4_4_);
                fVar2 = (float)((uint)((byte)(uVar21 >> 2) & 1) * auVar66._8_4_);
                fVar3 = (float)((uint)((byte)(uVar21 >> 3) & 1) * auVar66._12_4_);
                fVar4 = (float)((uint)((byte)(uVar21 >> 4) & 1) * auVar66._16_4_);
                fVar5 = (float)((uint)((byte)(uVar21 >> 5) & 1) * auVar66._20_4_);
                fVar6 = (float)((uint)((byte)(uVar21 >> 6) & 1) * auVar66._24_4_);
                auVar86._0_4_ = fVar1 * auVar61._0_4_;
                auVar86._4_4_ = fVar7 * auVar61._4_4_;
                auVar86._8_4_ = fVar2 * auVar61._8_4_;
                auVar86._12_4_ = fVar3 * auVar61._12_4_;
                auVar86._16_4_ = fVar4 * 0.0;
                auVar86._20_4_ = fVar5 * 0.0;
                auVar86._24_4_ = fVar6 * 0.0;
                auVar86._28_4_ = 0;
                auVar66 = vminps_avx512vl(auVar86,auVar65);
                auVar20._4_4_ = local_13a0._4_4_ * fVar7;
                auVar20._0_4_ = local_13a0._0_4_ * fVar1;
                auVar20._8_4_ = local_13a0._8_4_ * fVar2;
                auVar20._12_4_ = local_13a0._12_4_ * fVar3;
                auVar20._16_4_ = local_13a0._16_4_ * fVar4;
                auVar20._20_4_ = local_13a0._20_4_ * fVar5;
                auVar20._24_4_ = local_13a0._24_4_ * fVar6;
                auVar20._28_4_ = auVar64._28_4_;
                auVar64 = vminps_avx512vl(auVar20,auVar65);
                auVar67 = vsubps_avx512vl(auVar65,auVar66);
                auVar65 = vsubps_avx512vl(auVar65,auVar64);
                local_12c0 = vblendps_avx(auVar64,auVar67,0xf0);
                local_12e0 = vblendps_avx(auVar66,auVar65,0xf0);
                fVar7 = (float)DAT_02060940;
                fVar6 = DAT_02060940._4_4_;
                fVar5 = DAT_02060940._8_4_;
                fVar4 = DAT_02060940._12_4_;
                fVar3 = DAT_02060940._16_4_;
                fVar2 = DAT_02060940._20_4_;
                fVar1 = DAT_02060940._24_4_;
                local_1280[0] = local_1360._0_4_ * fVar7;
                local_1280[1] = local_1360._4_4_ * fVar6;
                local_1280[2] = local_1360._8_4_ * fVar5;
                local_1280[3] = local_1360._12_4_ * fVar4;
                fStack_1270 = local_1360._16_4_ * fVar3;
                fStack_126c = local_1360._20_4_ * fVar2;
                fStack_1268 = local_1360._24_4_ * fVar1;
                uStack_1264 = local_12e0._28_4_;
                local_1240._4_4_ = fStack_131c * fVar6;
                local_1240._0_4_ = local_1320 * fVar7;
                local_1240._8_4_ = fStack_1318 * fVar5;
                local_1240._12_4_ = fStack_1314 * fVar4;
                local_1240._16_4_ = fStack_1310 * fVar3;
                local_1240._20_4_ = fStack_130c * fVar2;
                local_1240._24_4_ = fStack_1308 * fVar1;
                local_1240._28_4_ = local_12e0._28_4_;
                local_1260[0] = local_1340._0_4_ * fVar7;
                local_1260[1] = local_1340._4_4_ * fVar6;
                local_1260[2] = local_1340._8_4_ * fVar5;
                local_1260[3] = local_1340._12_4_ * fVar4;
                fStack_1250 = local_1340._16_4_ * fVar3;
                fStack_124c = local_1340._20_4_ * fVar2;
                fStack_1248 = local_1340._24_4_ * fVar1;
                uStack_1244 = local_12c0._28_4_;
                uVar21 = (ulong)local_1300;
                auVar97 = ZEXT3264(local_1460);
                auVar105 = ZEXT3264(local_14a0);
                auVar107 = ZEXT3264(local_14c0);
                auVar114 = ZEXT3264(local_1500);
                auVar96 = ZEXT3264(local_1520);
                auVar93 = ZEXT3264(local_1540);
                auVar116 = ZEXT3264(local_1560);
                do {
                  auVar61 = auVar120._0_16_;
                  local_1420 = auVar121._0_32_;
                  uVar22 = 0;
                  for (uVar24 = uVar21; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000
                      ) {
                    uVar22 = uVar22 + 1;
                  }
                  local_15a8 = *(uint *)(local_13e0 + uVar22 * 4);
                  pGVar11 = (pSVar9->geometries).items[local_15a8].ptr;
                  if ((pGVar11->mask & ray->mask) == 0) {
LAB_0072aecf:
                    uVar21 = uVar21 ^ 1L << (uVar22 & 0x3f);
                    bVar13 = true;
                  }
                  else {
                    pRVar12 = context->args;
                    if ((pRVar12->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      uVar24 = (ulong)(uint)((int)uVar22 * 4);
                      local_15b4 = *(undefined4 *)(local_12e0 + uVar24);
                      local_15b0 = *(undefined4 *)(local_12c0 + uVar24);
                      local_1590.context = context->user;
                      local_15ac = *(undefined4 *)(local_1400 + uVar24);
                      local_15c0 = *(undefined4 *)((long)local_1280 + uVar24);
                      local_15bc = *(undefined4 *)((long)local_1260 + uVar24);
                      local_15b8 = *(undefined4 *)(local_1240 + uVar24);
                      local_15a4 = (local_1590.context)->instID[0];
                      local_15a0 = (local_1590.context)->instPrimID[0];
                      fVar7 = ray->tfar;
                      ray->tfar = *(float *)(local_12a0 + uVar24);
                      local_160c = -1;
                      local_1590.valid = &local_160c;
                      local_1590.geometryUserPtr = pGVar11->userPtr;
                      local_1590.hit = (RTCHitN *)&local_15c0;
                      local_1590.N = 1;
                      local_1440 = auVar122._0_32_;
                      local_1590.ray = (RTCRayN *)ray;
                      if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar11->occlusionFilterN)(&local_1590);
                        auVar116 = ZEXT3264(local_1560);
                        auVar93 = ZEXT3264(local_1540);
                        auVar96 = ZEXT3264(local_1520);
                        auVar114 = ZEXT3264(local_1500);
                        auVar107 = ZEXT3264(local_14c0);
                        auVar105 = ZEXT3264(local_14a0);
                        auVar97 = ZEXT3264(local_1460);
                        auVar122 = ZEXT3264(local_1440);
                        auVar121 = ZEXT3264(local_1420);
                        auVar61 = vxorps_avx512vl(auVar61,auVar61);
                        auVar120 = ZEXT1664(auVar61);
                        fVar89 = local_1480;
                        fVar98 = fStack_147c;
                        fVar99 = fStack_1478;
                        fVar100 = fStack_1474;
                        fVar101 = fStack_1470;
                        fVar102 = fStack_146c;
                        fVar103 = fStack_1468;
                        fVar87 = local_14e0;
                        fVar108 = fStack_14dc;
                        fVar109 = fStack_14d8;
                        fVar110 = fStack_14d4;
                        fVar111 = fStack_14d0;
                        fVar112 = fStack_14cc;
                        fVar113 = fStack_14c8;
                        if (*local_1590.valid != 0) goto LAB_0072b08e;
LAB_0072b13f:
                        ray->tfar = fVar7;
                        goto LAB_0072aecf;
                      }
LAB_0072b08e:
                      auVar61 = auVar120._0_16_;
                      if (pRVar12->filter != (RTCFilterFunctionN)0x0) {
                        if (((pRVar12->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((pGVar11->field_8).field_0x2 & 0x40) != 0)) {
                          (*pRVar12->filter)(&local_1590);
                          auVar116 = ZEXT3264(local_1560);
                          auVar93 = ZEXT3264(local_1540);
                          auVar96 = ZEXT3264(local_1520);
                          auVar114 = ZEXT3264(local_1500);
                          auVar107 = ZEXT3264(local_14c0);
                          auVar105 = ZEXT3264(local_14a0);
                          auVar97 = ZEXT3264(local_1460);
                          auVar122 = ZEXT3264(local_1440);
                          auVar121 = ZEXT3264(local_1420);
                          auVar61 = vxorps_avx512vl(auVar61,auVar61);
                          auVar120 = ZEXT1664(auVar61);
                          fVar89 = local_1480;
                          fVar98 = fStack_147c;
                          fVar99 = fStack_1478;
                          fVar100 = fStack_1474;
                          fVar101 = fStack_1470;
                          fVar102 = fStack_146c;
                          fVar103 = fStack_1468;
                          fVar87 = local_14e0;
                          fVar108 = fStack_14dc;
                          fVar109 = fStack_14d8;
                          fVar110 = fStack_14d4;
                          fVar111 = fStack_14d0;
                          fVar112 = fStack_14cc;
                          fVar113 = fStack_14c8;
                        }
                        if (*local_1590.valid == 0) goto LAB_0072b13f;
                      }
                    }
                    bVar13 = false;
                  }
                  iVar26 = 0;
                  if (!bVar13) {
                    lVar25 = local_1600;
                    lVar28 = local_15e0;
                    lVar29 = local_15e8;
                    lVar30 = local_15f0;
                    lVar31 = local_15f8;
                    lVar33 = local_1608;
                    if (bVar35) {
                      ray->tfar = -INFINITY;
                      iVar26 = 3;
                    }
                    goto LAB_0072b223;
                  }
                } while (uVar21 != 0);
              }
              iVar26 = 0;
              local_15c8 = local_15c8 + 1;
              bVar35 = local_15c8 < local_15d0;
              lVar25 = local_1600;
              lVar28 = local_15e0;
              lVar29 = local_15e8;
              lVar30 = local_15f0;
              lVar31 = local_15f8;
              lVar33 = local_1608;
            } while (local_15c8 != local_15d0);
          }
        }
LAB_0072b223:
      } while (iVar26 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }